

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

shared_ptr<Token> __thiscall Tokenizer::nextToken(Tokenizer *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer psVar3;
  undefined1 auVar4 [8];
  _Alloc_hider _Var5;
  undefined8 uVar6;
  char cVar7;
  bool bVar8;
  uint uVar9;
  undefined8 *puVar10;
  long lVar11;
  long extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  undefined8 *in_RSI;
  Token *__tmp;
  pointer psVar13;
  pointer psVar14;
  unsigned_long *__args_4;
  long lVar15;
  shared_ptr<Token> sVar16;
  int local_94;
  undefined8 local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  element_type *local_80;
  undefined1 auStack_78 [8];
  string str;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  int local_3c;
  undefined1 local_35;
  TokenType local_34 [2];
  TokenType matchTokenType;
  
  cVar7 = (**(code **)(*(long *)*in_RSI + 0x10))((long *)*in_RSI,0);
  psVar3 = rules.
           super__Vector_base<std::shared_ptr<TokenizerRule>,_std::allocator<std::shared_ptr<TokenizerRule>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (cVar7 == '\0') {
    str.field_2._8_4_ = 1;
    local_34[0] = Unknown;
    local_3c = 0;
    local_94 = 0;
    auStack_78 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Token,std::allocator<Token>,char_const(&)[10],TokenType,int,int,int>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&str,(Token **)auStack_78,
               (allocator<Token> *)&local_35,(char (*) [10])"EndOfFile",
               (TokenType *)(str.field_2._M_local_buf + 8),(int *)local_34,&local_3c,&local_94);
    _Var5 = str._M_dataplus;
    auVar4 = auStack_78;
    auStack_78 = (undefined1  [8])0x0;
    str._M_dataplus._M_p = (pointer)0x0;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[6];
    in_RSI[5] = auVar4;
    in_RSI[6] = _Var5._M_p;
    _Var12._M_pi = extraout_RDX_00;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      _Var12._M_pi = extraout_RDX_01;
    }
    if (str._M_dataplus._M_p != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)str._M_dataplus._M_p);
      _Var12._M_pi = extraout_RDX_02;
    }
  }
  else {
    local_34[0] = Unknown;
    psVar14 = rules.
              super__Vector_base<std::shared_ptr<TokenizerRule>,_std::allocator<std::shared_ptr<TokenizerRule>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_80 = (element_type *)this;
    if (rules.
        super__Vector_base<std::shared_ptr<TokenizerRule>,_std::allocator<std::shared_ptr<TokenizerRule>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        rules.
        super__Vector_base<std::shared_ptr<TokenizerRule>,_std::allocator<std::shared_ptr<TokenizerRule>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar15 = 0;
      uVar9 = 0;
    }
    else {
      do {
        psVar13 = psVar14 + 1;
        peVar1 = (psVar14->super___shared_ptr<TokenizerRule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_90 = *in_RSI;
        local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
        if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_88->_M_use_count = local_88->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_88->_M_use_count = local_88->_M_use_count + 1;
          }
        }
        uVar9 = (**peVar1->_vptr_TokenizerRule)(peVar1,&local_90);
        if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
        }
        local_34[0] = (*((psVar14->super___shared_ptr<TokenizerRule,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->_vptr_TokenizerRule[1])();
        lVar15 = extraout_RDX;
      } while (((uVar9 & 1) == 0) && (psVar14 = psVar13, psVar13 != psVar3));
    }
    if (((uVar9 & 1) == 0) || ((lVar15 == 0 || (local_34[0] == Unknown)))) {
      str._M_string_length._0_1_ = (**(code **)(*(long *)*in_RSI + 0x10))((long *)*in_RSI,0);
      this = (Tokenizer *)local_80;
      str._M_dataplus._M_p = (pointer)0x1;
      str._M_string_length._1_1_ = 0;
      str.field_2._8_8_ = (ulong)(uint)str.field_2._12_4_ << 0x20;
      auStack_78 = (undefined1  [8])&str._M_string_length;
      puVar10 = (undefined8 *)operator_new(0x50);
      puVar10[1] = 0x100000001;
      *puVar10 = &PTR___Sp_counted_ptr_inplace_0012f848;
      __gnu_cxx::new_allocator<Token>::
      construct<Token,std::__cxx11::string,TokenType,unsigned_long&,unsigned_long&,unsigned_long&>
                ((new_allocator<Token> *)&local_3c,(Token *)(puVar10 + 2),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_78,
                 (TokenType *)(str.field_2._M_local_buf + 8),in_RSI + 2,in_RSI + 3,in_RSI + 4);
      in_RSI[5] = (Token *)(puVar10 + 2);
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[6];
      in_RSI[6] = puVar10;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if (auStack_78 != (undefined1  [8])&str._M_string_length) {
        operator_delete((void *)auStack_78,
                        CONCAT62(str._M_string_length._2_6_,
                                 CONCAT11(str._M_string_length._1_1_,
                                          (undefined1)str._M_string_length)) + 1);
      }
      in_RSI[2] = in_RSI[2] + 1;
      in_RSI[4] = in_RSI[4] + 1;
      (**(code **)(*(long *)*in_RSI + 0x18))((long *)*in_RSI,1);
      _Var12._M_pi = extraout_RDX_03;
    }
    else {
      (**(code **)(*(long *)*in_RSI + 0x28))(auStack_78,(long *)*in_RSI,lVar15);
      this = (Tokenizer *)local_80;
      __args_4 = in_RSI + 4;
      str.field_2._8_8_ = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Token,std::allocator<Token>,std::__cxx11::string&,TokenType&,unsigned_long&,unsigned_long&,unsigned_long&>
                (a_Stack_50,(Token **)((long)&str.field_2 + 8),(allocator<Token> *)&local_3c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_78,
                 local_34,in_RSI + 2,in_RSI + 3,__args_4);
      _Var12._M_pi = a_Stack_50[0]._M_pi;
      uVar6 = str.field_2._8_8_;
      str.field_2._8_8_ = 0;
      a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[6];
      in_RSI[5] = uVar6;
      in_RSI[6] = _Var12._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
      }
      bVar8 = Token::isNewLine((string *)auStack_78);
      lVar11 = lVar15;
      if (bVar8) {
        *__args_4 = 1;
        lVar11 = 1;
        __args_4 = in_RSI + 3;
      }
      *__args_4 = *__args_4 + lVar11;
      in_RSI[2] = in_RSI[2] + lVar15;
      (**(code **)(*(long *)*in_RSI + 0x18))((long *)*in_RSI,lVar15);
      _Var12._M_pi = extraout_RDX_04;
      if (auStack_78 != (undefined1  [8])&str._M_string_length) {
        operator_delete((void *)auStack_78,
                        CONCAT62(str._M_string_length._2_6_,
                                 CONCAT11(str._M_string_length._1_1_,
                                          (undefined1)str._M_string_length)) + 1);
        _Var12._M_pi = extraout_RDX_05;
      }
    }
  }
  ((__shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2> *)
  &(((element_type *)this)->value)._M_dataplus)->_M_ptr = (element_type *)in_RSI[5];
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[6];
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(((element_type *)this)->value)._M_string_length)
  ->_M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  sVar16.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var12._M_pi;
  sVar16.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Token>)sVar16.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Token> Tokenizer::nextToken() noexcept {

  if (this->reader->charAt(0) == '\0') {
    this->token = std::make_shared<Token>("EndOfFile", TokenType::EndOfFile, 0, 0, 0);
    return this->token;
  }

  bool match = false;
  std::size_t matchSize = 0;
  TokenType matchTokenType = TokenType::Unknown;

  for (auto & rule : rules) {
    auto result = rule->tryMatch(this->reader);

    match = result.first;
    matchSize = result.second;
    matchTokenType = rule->getType();

    if (match) { break; }
  }

  if (match && matchSize > 0 && matchTokenType != TokenType::Unknown) {

    std::string str = this->reader->subString(matchSize);

    this->token = std::make_shared<Token>(
      str, matchTokenType, this->sourceIndex, this->sourceLine, this->sourceColumn);

    if (Token::isNewLine(str)) {
      this->sourceColumn = 1;
      this->sourceLine += 1;
    } else {
      this->sourceColumn += matchSize;
    }

    this->sourceIndex += matchSize;

    this->reader->advance(matchSize);

  } else {

    this->token = std::make_shared<Token>(
      std::string{this->reader->charAt(0)}, TokenType::Unknown,
      this->sourceIndex, this->sourceLine, this->sourceColumn);

    this->sourceIndex++;
    this->sourceColumn++;

    this->reader->advance(1);
  }

  return this->token;
}